

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool walkModelAndPipeline
               (Model *model,function<bool_(const_CoreML::Specification::Model_&)> *handler)

{
  bool bVar1;
  TypeCase TVar2;
  Pipeline *pPVar3;
  RepeatedPtrField<CoreML::Specification::Model> *pRVar4;
  reference pMVar5;
  PipelineRegressor *this;
  PipelineClassifier *this_00;
  function<bool_(const_CoreML::Specification::Model_&)> local_f0;
  reference local_d0;
  Model *m_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_2;
  reference local_90;
  Model *m_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::Model> *__range2_1;
  function<bool_(const_CoreML::Specification::Model_&)> local_60;
  reference local_40;
  Model *m;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::Model> *__range2;
  function<bool_(const_CoreML::Specification::Model_&)> *handler_local;
  Model *model_local;
  
  TVar2 = CoreML::Specification::Model::Type_case(model);
  if (TVar2 == kPipelineClassifier) {
    this_00 = CoreML::Specification::Model::pipelineclassifier(model);
    pPVar3 = CoreML::Specification::PipelineClassifier::pipeline(this_00);
    pRVar4 = CoreML::Specification::Pipeline::models(pPVar3);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m_2 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_2,(iterator *)&m_2), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_2);
      local_d0 = pMVar5;
      std::function<bool_(const_CoreML::Specification::Model_&)>::function(&local_f0,handler);
      bVar1 = walkModelAndPipeline(pMVar5,&local_f0);
      std::function<bool_(const_CoreML::Specification::Model_&)>::~function(&local_f0);
      if (bVar1) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_2);
    }
  }
  else if (TVar2 == kPipelineRegressor) {
    this = CoreML::Specification::Model::pipelineregressor(model);
    pPVar3 = CoreML::Specification::PipelineRegressor::pipeline(this);
    pRVar4 = CoreML::Specification::Pipeline::models(pPVar3);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m_1 = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2_1,(iterator *)&m_1), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2_1);
      local_90 = pMVar5;
      std::function<bool_(const_CoreML::Specification::Model_&)>::function
                ((function<bool_(const_CoreML::Specification::Model_&)> *)&__range2_2,handler);
      bVar1 = walkModelAndPipeline
                        (pMVar5,(function<bool_(const_CoreML::Specification::Model_&)> *)&__range2_2
                        );
      std::function<bool_(const_CoreML::Specification::Model_&)>::~function
                ((function<bool_(const_CoreML::Specification::Model_&)> *)&__range2_2);
      if (bVar1) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2_1);
    }
  }
  else if (TVar2 == kPipeline) {
    pPVar3 = CoreML::Specification::Model::pipeline(model);
    pRVar4 = CoreML::Specification::Pipeline::models(pPVar3);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::begin(pRVar4);
    m = (Model *)google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::end(pRVar4);
    while (bVar1 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::Model>::operator!=
                             (&__end2,(iterator *)&m), bVar1) {
      pMVar5 = google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
               operator*(&__end2);
      local_40 = pMVar5;
      std::function<bool_(const_CoreML::Specification::Model_&)>::function(&local_60,handler);
      bVar1 = walkModelAndPipeline(pMVar5,&local_60);
      std::function<bool_(const_CoreML::Specification::Model_&)>::~function(&local_60);
      if (bVar1) {
        return true;
      }
      google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::Model>::
      operator++(&__end2);
    }
  }
  bVar1 = std::function<bool_(const_CoreML::Specification::Model_&)>::operator()(handler,model);
  return bVar1;
}

Assistant:

static bool walkModelAndPipeline(const Specification::Model &model,
                                 std::function<bool(const Specification::Model& m)> handler) {
    switch (model.Type_case()) {
        case Specification::Model::kPipeline:
            for (auto &m : model.pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineRegressor:
            for (auto &m : model.pipelineregressor().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        case Specification::Model::kPipelineClassifier:
            for (auto &m : model.pipelineclassifier().pipeline().models()) {
                if (walkModelAndPipeline(m, handler)) {
                    return true;
                }
            }
            break;
        default:
            break;
    }
    if (handler(model)) {
        return true;
    }
    return false;
}